

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O3

color_rgba basisu::etc_block::unpack_color4(uint16_t packed_color4,bool scaled,uint32_t alpha)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined7 in_register_00000031;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (uint)packed_color4;
  uVar3 = uVar5 & 0xf;
  uVar2 = packed_color4 >> 4 & 0xf;
  uVar1 = (uint)(byte)(packed_color4 >> 8);
  uVar6 = uVar1 & 0xf;
  if ((int)CONCAT71(in_register_00000031,scaled) != 0) {
    uVar2 = uVar2 | uVar5 & 0xf0;
    uVar3 = uVar3 | (uVar5 & 0xf) << 4;
    uVar6 = uVar6 | (uVar1 & 0xf) << 4;
  }
  uVar4 = 0xff;
  if (alpha < 0xff) {
    uVar4 = alpha;
  }
  return (anon_union_4_2_6eba8969_for_color_rgba_0)
         (anon_union_4_2_6eba8969_for_color_rgba_0)
         (uVar2 << 8 | uVar3 << 0x10 | uVar4 << 0x18 | uVar6);
}

Assistant:

color_rgba etc_block::unpack_color4(uint16_t packed_color4, bool scaled, uint32_t alpha)
	{
		uint32_t b = packed_color4 & 15U;
		uint32_t g = (packed_color4 >> 4U) & 15U;
		uint32_t r = (packed_color4 >> 8U) & 15U;

		if (scaled)
		{
			b = (b << 4U) | b;
			g = (g << 4U) | g;
			r = (r << 4U) | r;
		}

		return color_rgba(cNoClamp, r, g, b, minimum(alpha, 255U));
	}